

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O0

void __thiscall
cmDebugServerConsole::ProcessRequest
          (cmDebugServerConsole *this,cmConnection *connection,string *request)

{
  cmDebugger *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  ostream *poVar9;
  void *this_00;
  reference pvVar10;
  char *pcVar11;
  cmMakefile *this_01;
  WatchpointType type;
  string local_c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  cmListFileContext local_be8;
  unsigned_long local_ba0;
  size_t line_1;
  size_type colonPlacement_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bpSpecifier_1;
  size_type space_2;
  allocator local_b41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  char *local_aa0;
  char *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> whatToPrint;
  stringstream local_a58 [8];
  stringstream ss_1;
  ostream local_a48;
  undefined1 local_8d0 [8];
  cmListFileBacktrace bt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  undefined1 local_7d0 [8];
  cmListFileContext currentLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  byte local_719;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  byte local_6f2;
  allocator local_6f1;
  undefined1 local_6f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> shellCmd;
  cmListFileContext local_6b0;
  cmListFileContext local_668;
  undefined1 local_620 [8];
  string fileLines;
  int ctxLines;
  cmPauseContext ctx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string local_540 [32];
  string local_520;
  unsigned_long local_500;
  size_t line;
  size_type colonPlacement;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bpSpecifier;
  size_type space_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string local_3a8;
  int local_388;
  allocator local_381;
  int clearWhat;
  long local_360;
  size_type space;
  string local_338;
  uint local_314;
  undefined1 local_310 [4];
  uint i_1;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> wps;
  undefined1 local_2f0 [4];
  uint i;
  vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> bps;
  stringstream ss;
  undefined1 local_2c8 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> whatToWatch_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> whatToWatch_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> whatToWatch;
  string *request_local;
  cmConnection *connection_local;
  cmDebugServerConsole *this_local;
  
  whatToWatch.field_2._8_8_ = request;
  bVar2 = std::operator==(request,"b");
  if (bVar2) {
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x15])();
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            whatToWatch.field_2._8_8_,"q");
    if (bVar2) {
      exit(0);
    }
    lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa5a338);
    if (lVar5 == 0) {
      std::__cxx11::string::substr((ulong)local_40,whatToWatch.field_2._8_8_);
      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      (*pcVar1->_vptr_cmDebugger[0x12])(pcVar1,local_40,0xb);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&whatToWatch_1.field_2 + 8),"Set watchpoint on write \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&whatToWatch_1.field_2 + 8),"\'\n");
      (**connection->_vptr_cmConnection)(connection,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)(whatToWatch_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_40);
    }
    else {
      lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa5a316);
      if (lVar5 == 0) {
        std::__cxx11::string::substr((ulong)local_b0,whatToWatch.field_2._8_8_);
        pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
        (*pcVar1->_vptr_cmDebugger[0x12])(pcVar1,local_b0,4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&whatToWatch_2.field_2 + 8),"Set watchpoint on read \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                      );
        std::operator+(&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&whatToWatch_2.field_2 + 8),"\'\n");
        (**connection->_vptr_cmConnection)(connection,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)(whatToWatch_2.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_b0);
      }
      else {
        lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa5a337);
        if (lVar5 == 0) {
          std::__cxx11::string::substr((ulong)local_110,whatToWatch.field_2._8_8_);
          pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
          (*pcVar1->_vptr_cmDebugger[0x12])(pcVar1,local_110,0xf);
          std::operator+(&local_150,"Set watchpoint on read/write \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110);
          std::operator+(&local_130,&local_150,"\'\n");
          (**connection->_vptr_cmConnection)(connection,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)local_110);
        }
        else {
          lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa5a35e);
          if (lVar5 == 0) {
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)
                       &bps.super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[7])
                      (local_2f0);
            for (wps.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                uVar6 = (ulong)wps.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                sVar7 = std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::size
                                  ((vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *)local_2f0)
                , uVar6 < sVar7;
                wps.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ =
                     wps.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
              pvVar8 = std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::operator[]
                                 ((vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *)local_2f0,
                                  (ulong)wps.
                                         super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              poVar9 = (ostream *)std::ostream::operator<<(local_2c8,pvVar8->Id);
              poVar9 = std::operator<<(poVar9," \tbreakpoint \t");
              pvVar8 = std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::operator[]
                                 ((vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *)local_2f0,
                                  (ulong)wps.
                                         super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              poVar9 = std::operator<<(poVar9,(string *)&pvVar8->File);
              poVar9 = std::operator<<(poVar9,":");
              pvVar8 = std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::operator[]
                                 ((vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *)local_2f0,
                                  (ulong)wps.
                                         super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              this_00 = (void *)std::ostream::operator<<(poVar9,pvVar8->Line);
              std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            }
            (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[8])
                      (local_310);
            for (local_314 = 0; uVar6 = (ulong)local_314,
                sVar7 = std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::size
                                  ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)local_310)
                , uVar6 < sVar7; local_314 = local_314 + 1) {
              pvVar10 = std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::operator[]
                                  ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)local_310,
                                   (ulong)local_314);
              poVar9 = (ostream *)std::ostream::operator<<(local_2c8,pvVar10->Id);
              poVar9 = std::operator<<(poVar9," \twatchpoint \t");
              pvVar10 = std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::operator[]
                                  ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)local_310,
                                   (ulong)local_314);
              poVar9 = std::operator<<(poVar9,(string *)&pvVar10->Variable);
              poVar9 = std::operator<<(poVar9," \t(");
              pvVar10 = std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::operator[]
                                  ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)local_310,
                                   (ulong)local_314);
              cmWatchpoint::GetTypeAsString_abi_cxx11_
                        (&local_338,(cmWatchpoint *)(ulong)pvVar10->Type,type);
              poVar9 = std::operator<<(poVar9,(string *)&local_338);
              poVar9 = std::operator<<(poVar9,")");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)&local_338);
            }
            std::__cxx11::stringstream::str();
            (**connection->_vptr_cmConnection)(connection,&space);
            std::__cxx11::string::~string((string *)&space);
            std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::~vector
                      ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)local_310);
            std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::~vector
                      ((vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *)local_2f0);
            std::__cxx11::stringstream::~stringstream
                      ((stringstream *)
                       &bps.super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
          }
          else {
            lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa5a388);
            if (lVar5 == 0) {
              local_360 = std::__cxx11::string::find((char)whatToWatch.field_2._8_8_,0x20);
              if (local_360 == -1) {
                (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger
                  [0x11])();
                (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger
                  [0x14])();
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&clearWhat,"Cleared all breakpoints and watchpoints\n",
                           &local_381);
                (**connection->_vptr_cmConnection)(connection,&clearWhat);
                std::__cxx11::string::~string((string *)&clearWhat);
                std::allocator<char>::~allocator((allocator<char> *)&local_381);
              }
              else {
                std::__cxx11::string::substr((ulong)&local_3a8,whatToWatch.field_2._8_8_);
                iVar4 = std::__cxx11::stoi(&local_3a8,(size_t *)0x0,10);
                std::__cxx11::string::~string((string *)&local_3a8);
                pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
                local_388 = iVar4;
                uVar3 = (*pcVar1->_vptr_cmDebugger[0xf])(pcVar1,(long)iVar4);
                if ((uVar3 & 1) == 0) {
                  pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
                  uVar3 = (*pcVar1->_vptr_cmDebugger[0x13])(pcVar1,(long)local_388);
                  if ((uVar3 & 1) == 0) {
                    std::__cxx11::to_string((string *)&space_1,local_388);
                    std::operator+(&local_4a8,"Could not find breakpoint or watchpoint with ID of ",
                                   (string *)&space_1);
                    std::operator+(&local_488,&local_4a8,"\n");
                    (**connection->_vptr_cmConnection)(connection,&local_488);
                    std::__cxx11::string::~string((string *)&local_488);
                    std::__cxx11::string::~string((string *)&local_4a8);
                    std::__cxx11::string::~string((string *)&space_1);
                  }
                  else {
                    std::__cxx11::to_string(&local_468,local_388);
                    std::operator+(&local_448,"Cleared watchpoint ",&local_468);
                    std::operator+(&local_428,&local_448,"\n");
                    (**connection->_vptr_cmConnection)(connection,&local_428);
                    std::__cxx11::string::~string((string *)&local_428);
                    std::__cxx11::string::~string((string *)&local_448);
                    std::__cxx11::string::~string((string *)&local_468);
                  }
                }
                else {
                  std::__cxx11::to_string(&local_408,local_388);
                  std::operator+(&local_3e8,"Cleared breakpoint ",&local_408);
                  std::operator+(&local_3c8,&local_3e8,"\n");
                  (**connection->_vptr_cmConnection)(connection,&local_3c8);
                  std::__cxx11::string::~string((string *)&local_3c8);
                  std::__cxx11::string::~string((string *)&local_3e8);
                  std::__cxx11::string::~string((string *)&local_408);
                }
              }
            }
            else {
              lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa5a363);
              if ((lVar5 == 0) &&
                 (bpSpecifier.field_2._8_8_ =
                       std::__cxx11::string::find((char)whatToWatch.field_2._8_8_,0x20),
                 bpSpecifier.field_2._8_8_ != -1)) {
                std::__cxx11::string::substr((ulong)&colonPlacement,whatToWatch.field_2._8_8_);
                line = std::__cxx11::string::find_last_of((char)&colonPlacement,0x3a);
                local_500 = 0xffffffffffffffff;
                if (line != 0xffffffffffffffff) {
                  std::__cxx11::string::substr((ulong)&local_520,(ulong)&colonPlacement);
                  iVar4 = std::__cxx11::stoi(&local_520,(size_t *)0x0,10);
                  local_500 = (unsigned_long)iVar4;
                  std::__cxx11::string::~string((string *)&local_520);
                  std::__cxx11::string::substr((ulong)local_540,(ulong)&colonPlacement);
                  std::__cxx11::string::operator=((string *)&colonPlacement,local_540);
                  std::__cxx11::string::~string(local_540);
                  pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
                  (*pcVar1->_vptr_cmDebugger[0xe])(pcVar1,(string *)&colonPlacement,local_500);
                  std::operator+(&local_5c0,"Break at ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&colonPlacement);
                  std::operator+(&local_5a0,&local_5c0,":");
                  std::__cxx11::to_string((string *)&ctx.Lock._M_owns,local_500);
                  std::operator+(&local_580,&local_5a0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ctx.Lock._M_owns);
                  std::operator+(&local_560,&local_580,"\n");
                  (**connection->_vptr_cmConnection)(connection,&local_560);
                  std::__cxx11::string::~string((string *)&local_560);
                  std::__cxx11::string::~string((string *)&local_580);
                  std::__cxx11::string::~string((string *)&ctx.Lock._M_owns);
                  std::__cxx11::string::~string((string *)&local_5a0);
                  std::__cxx11::string::~string((string *)&local_5c0);
                }
                std::__cxx11::string::~string((string *)&colonPlacement);
              }
            }
          }
        }
      }
    }
  }
  (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])();
  bVar2 = cmPauseContext::operator_cast_to_bool((cmPauseContext *)&ctxLines);
  if (bVar2) {
    lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa5a41d);
    if (lVar5 == 0) {
      cmPauseContext::StepOut((cmPauseContext *)&ctxLines);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              whatToWatch.field_2._8_8_,"c");
      if (bVar2) {
        cmPauseContext::Continue((cmPauseContext *)&ctxLines);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )whatToWatch.field_2._8_8_,"n");
        if (bVar2) {
          cmPauseContext::Step((cmPauseContext *)&ctxLines);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)whatToWatch.field_2._8_8_,"s");
          if (bVar2) {
            cmPauseContext::StepIn((cmPauseContext *)&ctxLines);
          }
          else {
            lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa46be9);
            if (lVar5 == 0) {
              fileLines.field_2._8_4_ = 10;
              cmPauseContext::CurrentLine(&local_668,(cmPauseContext *)&ctxLines);
              cmPauseContext::CurrentLine(&local_6b0,(cmPauseContext *)&ctxLines);
              getFileLines((string *)local_620,&local_668.FilePath,local_6b0.Line,
                           (long)(int)fileLines.field_2._8_4_);
              cmListFileContext::~cmListFileContext(&local_6b0);
              cmListFileContext::~cmListFileContext(&local_668);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&shellCmd.field_2 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_620,"\n");
              (**connection->_vptr_cmConnection)
                        (connection,(undefined1 *)((long)&shellCmd.field_2 + 8));
              std::__cxx11::string::~string((string *)(shellCmd.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)local_620);
            }
            else {
              lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa62eef);
              if (lVar5 == 0) {
                lVar5 = std::__cxx11::string::size();
                local_6f2 = 0;
                local_719 = 0;
                if (lVar5 == 4) {
                  std::allocator<char>::allocator();
                  local_6f2 = 1;
                  std::__cxx11::string::string((string *)local_6f0,"",&local_6f1);
                }
                else {
                  std::__cxx11::string::substr((ulong)&local_718,whatToWatch.field_2._8_8_);
                  local_719 = 1;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_6f0,&local_718," ");
                }
                if ((local_719 & 1) != 0) {
                  std::__cxx11::string::~string((string *)&local_718);
                }
                if ((local_6f2 & 1) != 0) {
                  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
                }
                cmPauseContext::CurrentLine
                          ((cmListFileContext *)&currentLine.Line,(cmPauseContext *)&ctxLines);
                std::operator+(&local_740,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6f0,&local_768);
                pcVar11 = (char *)std::__cxx11::string::c_str();
                system(pcVar11);
                std::__cxx11::string::~string((string *)&local_740);
                cmListFileContext::~cmListFileContext((cmListFileContext *)&currentLine.Line);
                std::__cxx11::string::~string((string *)local_6f0);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)whatToWatch.field_2._8_8_,"bt");
                if (bVar2) {
                  cmPauseContext::CurrentLine
                            ((cmListFileContext *)local_7d0,(cmPauseContext *)&ctxLines);
                  std::operator+(&local_890,"Paused at ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&currentLine.Name.field_2 + 8));
                  std::operator+(&local_870,&local_890,":");
                  std::__cxx11::to_string((string *)&bt.Cur,currentLine.FilePath.field_2._8_8_);
                  std::operator+(&local_850,&local_870,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&bt.Cur);
                  std::operator+(&local_830,&local_850," (");
                  std::operator+(&local_810,&local_830,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_7d0);
                  std::operator+(&local_7f0,&local_810,")\n");
                  (**connection->_vptr_cmConnection)(connection,&local_7f0);
                  std::__cxx11::string::~string((string *)&local_7f0);
                  std::__cxx11::string::~string((string *)&local_810);
                  std::__cxx11::string::~string((string *)&local_830);
                  std::__cxx11::string::~string((string *)&local_850);
                  std::__cxx11::string::~string((string *)&bt.Cur);
                  std::__cxx11::string::~string((string *)&local_870);
                  std::__cxx11::string::~string((string *)&local_890);
                  cmPauseContext::GetBacktrace
                            ((cmListFileBacktrace *)local_8d0,(cmPauseContext *)&ctxLines);
                  std::__cxx11::stringstream::stringstream(local_a58);
                  cmListFileBacktrace::PrintCallStack((cmListFileBacktrace *)local_8d0,&local_a48);
                  std::__cxx11::stringstream::str();
                  (**connection->_vptr_cmConnection)
                            (connection,(undefined1 *)((long)&whatToPrint.field_2 + 8));
                  std::__cxx11::string::~string((string *)(whatToPrint.field_2._M_local_buf + 8));
                  std::__cxx11::stringstream::~stringstream(local_a58);
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_8d0);
                  cmListFileContext::~cmListFileContext((cmListFileContext *)local_7d0);
                }
                else {
                  lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa5a42c);
                  if (lVar5 == 0) {
                    std::__cxx11::string::substr((ulong)&val,whatToWatch.field_2._8_8_);
                    this_01 = cmPauseContext::GetMakefile((cmPauseContext *)&ctxLines);
                    local_aa0 = cmMakefile::GetDefinition(this_01,(string *)&val);
                    if (local_aa0 == (char *)0x0) {
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&space_2,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&val," isn\'t set.\n");
                      (**connection->_vptr_cmConnection)(connection,&space_2);
                      std::__cxx11::string::~string((string *)&space_2);
                    }
                    else {
                      std::operator+(&local_b20,"$ ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&val);
                      std::operator+(&local_b00,&local_b20," = ");
                      pcVar11 = local_aa0;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_b40,pcVar11,&local_b41);
                      std::operator+(&local_ae0,&local_b00,&local_b40);
                      std::operator+(&local_ac0,&local_ae0,"\n");
                      (**connection->_vptr_cmConnection)(connection,&local_ac0);
                      std::__cxx11::string::~string((string *)&local_ac0);
                      std::__cxx11::string::~string((string *)&local_ae0);
                      std::__cxx11::string::~string((string *)&local_b40);
                      std::allocator<char>::~allocator((allocator<char> *)&local_b41);
                      std::__cxx11::string::~string((string *)&local_b00);
                      std::__cxx11::string::~string((string *)&local_b20);
                    }
                    std::__cxx11::string::~string((string *)&val);
                  }
                  else {
                    lVar5 = std::__cxx11::string::find((char *)whatToWatch.field_2._8_8_,0xa5a363);
                    if ((lVar5 == 0) &&
                       (bpSpecifier_1.field_2._8_8_ =
                             std::__cxx11::string::find((char)whatToWatch.field_2._8_8_,0x20),
                       bpSpecifier_1.field_2._8_8_ != -1)) {
                      std::__cxx11::string::substr
                                ((ulong)&colonPlacement_1,whatToWatch.field_2._8_8_);
                      line_1 = std::__cxx11::string::find_last_of((char)&colonPlacement_1,0x3a);
                      local_ba0 = 0xffffffffffffffff;
                      if (line_1 == 0xffffffffffffffff) {
                        pcVar11 = (char *)std::__cxx11::string::c_str();
                        iVar4 = isdigit((int)*pcVar11);
                        if (iVar4 != 0) {
                          iVar4 = std::__cxx11::stoi((string *)&colonPlacement_1,(size_t *)0x0,10);
                          local_ba0 = (unsigned_long)iVar4;
                          cmPauseContext::CurrentLine(&local_be8,(cmPauseContext *)&ctxLines);
                          std::__cxx11::string::operator=
                                    ((string *)&colonPlacement_1,(string *)&local_be8.FilePath);
                          cmListFileContext::~cmListFileContext(&local_be8);
                          pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
                          (*pcVar1->_vptr_cmDebugger[0xe])
                                    (pcVar1,(string *)&colonPlacement_1,local_ba0);
                          std::operator+(&local_c68,"Break at ",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&colonPlacement_1);
                          std::operator+(&local_c48,&local_c68,":");
                          std::__cxx11::to_string(&local_c88,local_ba0);
                          std::operator+(&local_c28,&local_c48,&local_c88);
                          std::operator+(&local_c08,&local_c28,"\n");
                          (**connection->_vptr_cmConnection)(connection,&local_c08);
                          std::__cxx11::string::~string((string *)&local_c08);
                          std::__cxx11::string::~string((string *)&local_c28);
                          std::__cxx11::string::~string((string *)&local_c88);
                          std::__cxx11::string::~string((string *)&local_c48);
                          std::__cxx11::string::~string((string *)&local_c68);
                        }
                      }
                      std::__cxx11::string::~string((string *)&colonPlacement_1);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    printPrompt(this,connection);
    fileLines.field_2._12_4_ = 0;
  }
  else {
    fileLines.field_2._12_4_ = 1;
  }
  cmPauseContext::~cmPauseContext((cmPauseContext *)&ctxLines);
  return;
}

Assistant:

void cmDebugServerConsole::ProcessRequest(cmConnection* connection,
                                          const std::string& request)
{
  if (request == "b") {
    Debugger.Break();
  } else if (request == "q") {
    exit(0);
  } else if (request.find("watch ") == 0) {
    auto whatToWatch = request.substr(strlen("watch "));
    Debugger.SetWatchpoint(whatToWatch);
    connection->WriteData("Set watchpoint on write '" + whatToWatch + "'\n");
  } else if (request.find("rwatch ") == 0) {
    auto whatToWatch = request.substr(strlen("rwatch "));
    Debugger.SetWatchpoint(whatToWatch, cmWatchpoint::WATCHPOINT_READ);
    connection->WriteData("Set watchpoint on read '" + whatToWatch + "'\n");
  } else if (request.find("awatch ") == 0) {
    auto whatToWatch = request.substr(strlen("awatch "));
    Debugger.SetWatchpoint(whatToWatch, cmWatchpoint::WATCHPOINT_ALL);
    connection->WriteData("Set watchpoint on read/write '" + whatToWatch +
                          "'\n");
  } else if (request.find("info br") == 0) {
    std::stringstream ss;
    auto bps = Debugger.GetBreakpoints();
    for (unsigned i = 0; i < bps.size(); i++) {
      ss << bps[i].Id << " \tbreakpoint \t" << bps[i].File << ":"
         << bps[i].Line << std::endl;
    }
    auto wps = Debugger.GetWatchpoints();
    for (unsigned i = 0; i < wps.size(); i++) {
      ss << wps[i].Id << " \twatchpoint \t" << wps[i].Variable << " \t("
         << cmWatchpoint::GetTypeAsString(wps[i].Type) << ")" << std::endl;
    }
    connection->WriteData(ss.str());
  } else if (request.find("clear") == 0) {
    auto space = request.find(' ');
    if (space == std::string::npos) {
      Debugger.ClearAllBreakpoints();
      Debugger.ClearAllWatchpoints();
      connection->WriteData("Cleared all breakpoints and watchpoints\n");
    } else {
      auto clearWhat = stoi(request.substr(space));

      if (Debugger.ClearBreakpoint(clearWhat)) {
        connection->WriteData("Cleared breakpoint " +
                              std::to_string(clearWhat) + "\n");
      } else if (Debugger.ClearWatchpoint(clearWhat)) {
        connection->WriteData("Cleared watchpoint " +
                              std::to_string(clearWhat) + "\n");
      } else {
        connection->WriteData(
          "Could not find breakpoint or watchpoint with ID of " +
          std::to_string(clearWhat) + "\n");
      }
    }
  } else if (request.find("br") == 0) {
    auto space = request.find(' ');

    // The state doesn't matter if we set an absolute path, so handle that
    // here.
    if (space != std::string::npos) {
      auto bpSpecifier = request.substr(space + 1);
      auto colonPlacement = bpSpecifier.find_last_of(':');
      size_t line = (size_t)-1;

      if (colonPlacement != std::string::npos) {
        line = std::stoi(bpSpecifier.substr(colonPlacement + 1));
        bpSpecifier = bpSpecifier.substr(0, colonPlacement);

        Debugger.SetBreakpoint(bpSpecifier, line);
        connection->WriteData("Break at " + bpSpecifier + ":" +
                              std::to_string(line) + "\n");
      }
    }
  }

  auto ctx = Debugger.PauseContext();
  if (!ctx) {
    return;
  }

  if (request.find("fin") == 0) {
    ctx.StepOut();
  } else if (request == "c") {
    ctx.Continue();
  } else if (request == "n") {
    ctx.Step();
  } else if (request == "s") {
    ctx.StepIn();
  } else if (request.find("l") == 0) {
    auto ctxLines = 10;
    auto fileLines = getFileLines(ctx.CurrentLine().FilePath,
                                  ctx.CurrentLine().Line, ctxLines);
    connection->WriteData(fileLines + "\n");
  } else if (request.find("open") == 0) {
    auto shellCmd =
      request.size() == 4 ? "" : (request.substr(strlen("open ")) + " ");
    system((shellCmd + ctx.CurrentLine().FilePath).c_str());
  } else if (request == "bt") {
    auto currentLine = ctx.CurrentLine();
    connection->WriteData("Paused at " + currentLine.FilePath + ":" +
                          std::to_string(currentLine.Line) + " (" +
                          currentLine.Name + ")\n");

    auto bt = ctx.GetBacktrace();
    std::stringstream ss;
    bt.PrintCallStack(ss);
    connection->WriteData(ss.str());
  } else if (request.find("print ") == 0) {
    auto whatToPrint = request.substr(strlen("print "));
    auto val = ctx.GetMakefile()->GetDefinition(whatToPrint);
    if (val) {
      connection->WriteData("$ " + whatToPrint + " = " + std::string(val) +
                            "\n");
    } else {
      connection->WriteData(whatToPrint + " isn't set.\n");
    }
  } else if (request.find("br") == 0) {
    auto space = request.find(' ');
    if (space != std::string::npos) {
      auto bpSpecifier = request.substr(space + 1);
      auto colonPlacement = bpSpecifier.find_last_of(':');
      size_t line = (size_t)-1;

      if (colonPlacement == std::string::npos &&
          isdigit(*bpSpecifier.c_str())) {
        line = std::stoi(bpSpecifier);
        bpSpecifier = ctx.CurrentLine().FilePath;
        Debugger.SetBreakpoint(bpSpecifier, line);
        connection->WriteData("Break at " + bpSpecifier + ":" +
                              std::to_string(line) + "\n");
      }
    }
  }

  printPrompt(connection);
}